

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O0

void to_utf16_test(void)

{
  ostream *poVar1;
  allocator<char> local_101;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  allocator<char> local_49;
  string local_48;
  undefined1 local_28 [8];
  string s;
  
  print_utf16(0x41);
  print_utf16(0xf7);
  print_utf16(0x3c0);
  print_utf16(0x16059);
  print_utf16(0xdead);
  print_utf16(0x7fffffff);
  print_utf16(0x80000000);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,anon_var_dwarf_4b26 + 5,&local_49);
  QUtil::utf8_to_utf16((string *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  QUtil::utf16_to_utf8(&local_80,(string *)local_28);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_80);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_80);
  std::operator+(&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28,".");
  QUtil::utf16_to_utf8(&local_a0,&local_c0);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_a0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  poVar1 = std::operator<<((ostream *)&std::cout,"LE: ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,anon_var_dwarf_49ee,&local_101);
  QUtil::utf16_to_utf8(&local_e0,&local_100);
  poVar1 = std::operator<<(poVar1,(string *)&local_e0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

void
to_utf16_test()
{
    print_utf16(0x41UL);
    print_utf16(0xF7UL);
    print_utf16(0x3c0UL);
    print_utf16(0x16059UL);
    print_utf16(0xdeadUL);
    print_utf16(0x7fffffffUL);
    print_utf16(0x80000000UL);

    std::string s(QUtil::utf8_to_utf16("\xcf\x80"));
    std::cout << QUtil::utf16_to_utf8(s) << std::endl;
    std::cout << QUtil::utf16_to_utf8(s + ".") << std::endl;
    std::cout << "LE: " << QUtil::utf16_to_utf8("\xff\xfe\xc0\x03") << std::endl;
}